

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::PrintFindStuff(cmFindBase *this)

{
  ostream *poVar1;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  cmFindBase *local_10;
  cmFindBase *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchFrameworkLast: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchFrameworkLast & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchFrameworkOnly: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchFrameworkOnly & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchFrameworkFirst: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchFrameworkFirst & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchAppBundleLast: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchAppBundleLast & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchAppBundleOnly: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchAppBundleOnly & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"SearchAppBundleFirst: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).SearchAppBundleFirst & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"VariableName ");
  poVar1 = std::operator<<(poVar1,(string *)&this->VariableName);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"VariableDocumentation ");
  poVar1 = std::operator<<(poVar1,(string *)&this->VariableDocumentation);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"NoDefaultPath ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->super_cmFindCommon).NoDefaultPath & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"NoCMakeEnvironmentPath ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).NoCMakeEnvironmentPath & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"NoCMakePath ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->super_cmFindCommon).NoCMakePath & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"NoSystemEnvironmentPath ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->super_cmFindCommon).NoSystemEnvironmentPath & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"NoCMakeSystemPath ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->super_cmFindCommon).NoCMakeSystemPath & 1))
  ;
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"EnvironmentPath ");
  poVar1 = std::operator<<(poVar1,(string *)&this->EnvironmentPath);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"CMakePathName ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_cmFindCommon).CMakePathName);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"Names  ");
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_30,&this->Names," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"SearchPathSuffixes  ");
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_60,&(this->super_cmFindCommon).SearchPathSuffixes,"\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<((ostream *)&std::cerr,"SearchPaths\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"[",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"]",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"\n",&local_f1);
  cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_80,&local_a0,&(this->super_cmFindCommon).SearchPaths,&local_c8,&local_f0);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_80);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return;
}

Assistant:

void cmFindBase::PrintFindStuff()
{
  std::cerr << "SearchFrameworkLast: " << this->SearchFrameworkLast << "\n";
  std::cerr << "SearchFrameworkOnly: " << this->SearchFrameworkOnly << "\n";
  std::cerr << "SearchFrameworkFirst: " << this->SearchFrameworkFirst << "\n";
  std::cerr << "SearchAppBundleLast: " << this->SearchAppBundleLast << "\n";
  std::cerr << "SearchAppBundleOnly: " << this->SearchAppBundleOnly << "\n";
  std::cerr << "SearchAppBundleFirst: " << this->SearchAppBundleFirst << "\n";
  std::cerr << "VariableName " << this->VariableName << "\n";
  std::cerr << "VariableDocumentation " << this->VariableDocumentation << "\n";
  std::cerr << "NoDefaultPath " << this->NoDefaultPath << "\n";
  std::cerr << "NoCMakeEnvironmentPath " << this->NoCMakeEnvironmentPath
            << "\n";
  std::cerr << "NoCMakePath " << this->NoCMakePath << "\n";
  std::cerr << "NoSystemEnvironmentPath " << this->NoSystemEnvironmentPath
            << "\n";
  std::cerr << "NoCMakeSystemPath " << this->NoCMakeSystemPath << "\n";
  std::cerr << "EnvironmentPath " << this->EnvironmentPath << "\n";
  std::cerr << "CMakePathName " << this->CMakePathName << "\n";
  std::cerr << "Names  " << cmJoin(this->Names, " ") << "\n";
  std::cerr << "\n";
  std::cerr << "SearchPathSuffixes  ";
  std::cerr << cmJoin(this->SearchPathSuffixes, "\n") << "\n";
  std::cerr << "SearchPaths\n";
  std::cerr << cmWrap("[", this->SearchPaths, "]", "\n") << "\n";
}